

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall
Simplification_distributive2_2_Test::TestBody(Simplification_distributive2_2_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr *ex;
  AssertHelper local_e8;
  Message local_e0;
  string local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  ExprPtr local_98;
  undefined1 local_88 [8];
  ExprPtr e;
  ExprPtr f3o2;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  ExprPtr x;
  ExprPtr n2;
  Simplification_distributive2_2_Test *this_local;
  
  mathiu::impl::operator____i
            ((impl *)&x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"x",&local_51);
  mathiu::impl::symbol((impl *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  mathiu::impl::fraction((int)&e + 8,3);
  mathiu::impl::operator*
            ((impl *)&local_98,
             (ExprPtr *)
             &x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ExprPtr *)local_30);
  mathiu::impl::operator*
            ((impl *)&gtest_ar.message_,
             (ExprPtr *)
             &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ExprPtr *)local_30);
  mathiu::impl::operator+((impl *)local_88,&local_98,(ExprPtr *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_98);
  mathiu::impl::toString_abi_cxx11_(&local_d8,(impl *)local_88,ex);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
            ((EqHelper *)local_b8,"toString(e)","\"(* 7/2 x)\"",&local_d8,(char (*) [10])"(* 7/2 x)"
            );
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x5a,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_88);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &x.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Simplification, distributive2_2)
{
    auto const n2 = 2_i;
    auto const x = symbol("x");
    auto const f3o2 = fraction(3, 2);
    auto const e = n2 * x + f3o2 * x;
    EXPECT_EQ(toString(e), "(* 7/2 x)");
}